

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O2

Aig_Obj_t * Kit_GraphToAigInternal(Aig_Man_t *pMan,Kit_Graph_t *pGraph)

{
  uint uVar1;
  Kit_Node_t *pKVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *local_38;
  
  if (pGraph->fConst == 0) {
    uVar6 = (ulong)(uint)pGraph->nLeaves;
    uVar4 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar4 < (uint)pGraph->nLeaves) {
      pAVar3 = (Aig_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pGraph->pNodes[uVar4].field_2.pFunc);
    }
    else {
      lVar5 = uVar6 * 0x18;
      local_38 = (undefined1 *)0x0;
      for (; (long)uVar6 < (long)pGraph->nSize; uVar6 = uVar6 + 1) {
        pKVar2 = pGraph->pNodes;
        local_38 = &(pKVar2->eEdge0).field_0x0 + lVar5;
        uVar4 = *(uint *)(&(pKVar2->eEdge0).field_0x0 + lVar5);
        uVar1 = *(uint *)(&(pKVar2->eEdge1).field_0x0 + lVar5);
        pAVar3 = Aig_And(pMan,(Aig_Obj_t *)
                              ((ulong)(uVar4 & 1) ^
                              (ulong)pKVar2[uVar4 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Aig_Obj_t *)
                         ((ulong)(uVar1 & 1) ^ (ulong)pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Aig_Obj_t **)((long)&pKVar2->field_2 + lVar5) = pAVar3;
        lVar5 = lVar5 + 0x18;
      }
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ *(ulong *)(local_38 + 8));
    }
  }
  else {
    pAVar3 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pMan->pConst1);
  }
  return pAVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Kit_GraphToAigInternal( Aig_Man_t * pMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    Aig_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Aig_NotCond( Aig_ManConst1(pMan), Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Aig_NotCond( (Aig_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Aig_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Aig_NotCond( (Aig_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}